

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglBufferAgeTests.cpp
# Opt level: O1

void __thiscall deqp::egl::anon_unknown_0::BufferAgeTest::~BufferAgeTest(BufferAgeTest *this)

{
  ~BufferAgeTest(this);
  operator_delete(this,0x1b18);
  return;
}

Assistant:

BufferAgeTest::~BufferAgeTest (void)
{
	deinit();
}